

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::section::Type<1,458>::TabulatedComponents::
print<std::back_insert_iterator<std::__cxx11::string>>
          (TabulatedComponents *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,int MAT,int MF,int MT)

{
  long lVar1;
  
  ListRecord::print<std::back_insert_iterator<std::__cxx11::string>>
            ((ListRecord *)(this + 8),it,MAT,MF,MT);
  lVar1 = 0;
  do {
    if (this[lVar1 + 0xe0] == (TabulatedComponents)0x1) {
      TabulationRecord::print<std::back_insert_iterator<std::__cxx11::string>>
                ((TabulationRecord *)(this + lVar1 + 0x50),it,MAT,MF,MT);
    }
    lVar1 = lVar1 + 0x98;
  } while (lVar1 != 0x558);
  return;
}

Assistant:

void print( OutputIterator& it, int MAT, int MF, int MT ) const {

  this->values_.print( it, MAT, MF, MT );
  for ( auto& entry : this->components_ ) {
    if ( entry ) { entry->print( it, MAT, MF, MT ); }
  }
}